

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
emplaceRealloc<std::pair<unsigned_long,unsigned_long>>
          (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *this,pointer pos,
          pair<unsigned_long,_unsigned_long> *args)

{
  ulong uVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  pointer ppVar4;
  long lVar5;
  unsigned_long *puVar6;
  long lVar7;
  ulong capacity;
  
  if (*(long *)(this + 8) == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar7 = (long)pos - *(long *)this;
  puVar3 = (unsigned_long *)detail::allocArray(capacity,0x10);
  uVar2 = args->second;
  *(unsigned_long *)((long)puVar3 + lVar7) = args->first;
  ((unsigned_long *)((long)puVar3 + lVar7))[1] = uVar2;
  ppVar4 = *(pointer *)this;
  lVar5 = *(long *)(this + 8);
  if (ppVar4 + lVar5 == pos) {
    puVar6 = puVar3;
    if (lVar5 != 0) {
      do {
        uVar2 = ppVar4->second;
        *puVar6 = ppVar4->first;
        puVar6[1] = uVar2;
        ppVar4 = ppVar4 + 1;
        puVar6 = puVar6 + 2;
      } while (ppVar4 != pos);
    }
  }
  else {
    puVar6 = puVar3;
    if (ppVar4 != pos) {
      do {
        uVar2 = ppVar4->second;
        *puVar6 = ppVar4->first;
        puVar6[1] = uVar2;
        ppVar4 = ppVar4 + 1;
        puVar6 = puVar6 + 2;
      } while (ppVar4 != pos);
      ppVar4 = *(pointer *)this;
      lVar5 = *(long *)(this + 8);
    }
    if (ppVar4 + lVar5 != pos) {
      puVar6 = (unsigned_long *)((long)puVar3 + lVar7);
      do {
        uVar2 = pos->second;
        puVar6[2] = pos->first;
        puVar6[3] = uVar2;
        pos = pos + 1;
        puVar6 = puVar6 + 2;
      } while (pos != ppVar4 + lVar5);
    }
  }
  if (*(SmallVectorBase<std::pair<unsigned_long,unsigned_long>> **)this != this + 0x18) {
    free(*(SmallVectorBase<std::pair<unsigned_long,unsigned_long>> **)this);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = capacity;
  *(unsigned_long **)this = puVar3;
  return (pointer)((long)puVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}